

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall CfgNode::BlockData::addCall(BlockData *this,CFG *cfg,unsigned_long_long count)

{
  bool bVar1;
  pointer ppVar2;
  CfgCall *this_00;
  mapped_type *ppCVar3;
  CfgCall *cfgCall_1;
  CfgCall *cfgCall;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_CfgCall_*>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_CfgCall_*>_> local_30;
  const_iterator it;
  Addr addr;
  unsigned_long_long count_local;
  CFG *cfg_local;
  BlockData *this_local;
  
  it._M_node = (_Base_ptr)CFG::addr(cfg);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
       ::find(&this->m_calls,(key_type *)&it);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_CfgCall_*>_>::_Rb_tree_const_iterator
            (&local_30,&local_38);
  cfgCall = (CfgCall *)
            std::
            map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
            ::end(&this->m_calls);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_CfgCall_*>_>::_Rb_tree_const_iterator
            (&local_40,(iterator *)&cfgCall);
  bVar1 = std::operator!=(&local_30,&local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_CfgCall_*>_>::operator->
                       (&local_30);
    CfgCall::updateCount(ppVar2->second,count);
  }
  else {
    this_00 = (CfgCall *)operator_new(0x18);
    CfgCall::CfgCall(this_00,cfg,count);
    ppCVar3 = std::
              map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
              ::operator[](&this->m_calls,(key_type *)&it);
    *ppCVar3 = this_00;
  }
  return;
}

Assistant:

void CfgNode::BlockData::addCall(CFG* cfg, unsigned long long count) {
	Addr addr = cfg->addr();
	std::map<Addr, CfgCall*>::const_iterator it = m_calls.find(addr);
	if (it != m_calls.end()) {
		CfgCall* cfgCall = it->second;
		cfgCall->updateCount(count);
	} else {
		CfgCall* cfgCall = new CfgCall(cfg, count);
		m_calls[addr] = cfgCall;
	}
}